

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
hashStringifyModule(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   Module *wasm)

{
  Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
  local_220;
  _Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  undefined4 uStack_e0;
  undefined4 local_dc;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_wasm::StringifyEquator,_wasm::StringifyHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d8;
  void *local_a0;
  undefined8 uStack_98;
  long local_90;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_88;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::Name>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  local_58;
  
  memset(&local_220,0,0x1f8);
  std::_Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::_M_initialize_map
            (&local_148,0);
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  uStack_e0 = 0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_dc = 0xffffffff;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  local_a0 = (void *)0x0;
  uStack_98 = 0;
  local_90 = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  ::wasm::
  Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
  ::walkModule(&local_220,wasm);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__,&local_f8)
  ;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::Name>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::~_Rb_tree(&local_58);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_88);
  if (local_a0 != (void *)0x0) {
    operator_delete(local_a0,local_90 - (long)local_a0);
  }
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_wasm::StringifyEquator,_wasm::StringifyHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_d8);
  if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    CONCAT44(local_f8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_f8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Deque_base
            (&local_148);
  if (local_220.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_220.stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_220.stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_220.stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> hashStringifyModule(Module* wasm) {
  HashStringifyWalker stringify = HashStringifyWalker();
  stringify.walkModule(wasm);
  return stringify.hashString;
}